

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

shared_ptr<Jupiter::IRC::Client::User> __thiscall
Jupiter::IRC::Client::findUserOrAdd(Client *this,string_view in_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  value_type in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view in_nickname;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>,_bool>
  pVar2;
  shared_ptr<Jupiter::IRC::Client::User> sVar3;
  shared_ptr<Jupiter::IRC::Client::User> user;
  shared_ptr<Jupiter::IRC::Client::User> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  username_hostname;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  name_split;
  string_view in_name_local;
  
  in_name_local._M_len = (size_t)in_name._M_str;
  in_nickname._M_len = in_name._M_len;
  jessilib::split_once<,std::basic_string_view<char,std::char_traits<char>>>
            (&name_split,(jessilib *)&in_name_local,
             (basic_string_view<char,_std::char_traits<char>_> *)0x21,in_CL);
  in_nickname._M_str = (char *)name_split.first._M_string_length;
  getUser((Client *)&result,in_nickname);
  _Var1 = result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  if (result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    jessilib::split_once<,std::__cxx11::string>
              (&username_hostname,(jessilib *)&name_split.second,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40,
               (value_type)name_split.first._M_dataplus._M_p);
    std::make_shared<Jupiter::IRC::Client::User>();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_nickname,&name_split.first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_username,&username_hostname.first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_hostname,&username_hostname.second);
    pVar2 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::shared_ptr<Jupiter::IRC::Client::User>&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)(in_nickname._M_len + 0x278),
                       &(user.
                         super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_nickname);
    std::__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)pVar2.first.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
               + 0x28));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&username_hostname);
  }
  else {
    (this->super_Thinker)._vptr_Thinker =
         (_func_int **)
         result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_socket)._M_t.
    super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
    super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
    super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl = (Socket *)_Var1._M_pi;
    result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&name_split);
  sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::User>)
         sVar3.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::User> Jupiter::IRC::Client::findUserOrAdd(std::string_view in_name) {
	// in_name: Nickname!Username@Hostname
	// Assume: Nickname can contain anything but !
	// Assume: Username can contain anything but @
	// Assume: Hostname can contain anything
	auto name_split = jessilib::split_once(in_name, '!');

	auto result = getUser(name_split.first);
	if (result != nullptr) {
		return result;
	}

	auto username_hostname = jessilib::split_once(name_split.second, '@');

	auto user = std::make_shared<User>();
	user->m_nickname = name_split.first;
	user->m_username = username_hostname.first;
	user->m_hostname = username_hostname.second;
	return m_users.emplace(user->m_nickname, user).first->second;
}